

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O1

char * read_referenced_name_from_attr
                 (dwarf_data *ddata,unit *u,attr *attr,attr_val *val,
                 backtrace_error_callback error_callback,void *data)

{
  long *plVar1;
  char *pcVar2;
  uint64_t offset;
  unit *u_00;
  anon_union_8_3_08205623_for_u local_30;
  
  if (((attr->name == DW_AT_specification) || (attr->name == DW_AT_abstract_origin)) &&
     (attr->form != DW_FORM_ref_sig8)) {
    switch(val->encoding) {
    case ATTR_VAL_UINT:
    case ATTR_VAL_REF_UNIT:
      pcVar2 = read_referenced_name(ddata,u,(val->u).uint,error_callback,data);
      return pcVar2;
    case ATTR_VAL_REF_INFO:
      local_30 = val->u;
      plVar1 = (long *)bsearch(&local_30,ddata->units,ddata->units_count,8,units_search);
      if (plVar1 == (long *)0x0) {
        u_00 = (unit *)0x0;
      }
      else {
        u_00 = (unit *)*plVar1;
      }
      if (u_00 != (unit *)0x0) {
        offset = (long)(val->u).string - u_00->low_offset;
LAB_0012db58:
        pcVar2 = read_referenced_name(ddata,u_00,offset,error_callback,data);
        return pcVar2;
      }
      break;
    case ATTR_VAL_REF_ALT_INFO:
      local_30 = val->u;
      plVar1 = (long *)bsearch(&local_30,ddata->altlink->units,ddata->altlink->units_count,8,
                               units_search);
      if (plVar1 == (long *)0x0) {
        u_00 = (unit *)0x0;
      }
      else {
        u_00 = (unit *)*plVar1;
      }
      if (u_00 != (unit *)0x0) {
        offset = (long)(val->u).string - u_00->low_offset;
        ddata = ddata->altlink;
        goto LAB_0012db58;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

static const char *
read_referenced_name_from_attr (struct dwarf_data *ddata, struct unit *u,
				struct attr *attr, struct attr_val *val,
				backtrace_error_callback error_callback,
				void *data)
{
  switch (attr->name)
    {
    case DW_AT_abstract_origin:
    case DW_AT_specification:
      break;
    default:
      return NULL;
    }

  if (attr->form == DW_FORM_ref_sig8)
    return NULL;

  if (val->encoding == ATTR_VAL_REF_INFO)
    {
      struct unit *unit
	= find_unit (ddata->units, ddata->units_count,
		     val->u.uint);
      if (unit == NULL)
	return NULL;

      uint64_t offset = val->u.uint - unit->low_offset;
      return read_referenced_name (ddata, unit, offset, error_callback, data);
    }

  if (val->encoding == ATTR_VAL_UINT
      || val->encoding == ATTR_VAL_REF_UNIT)
    return read_referenced_name (ddata, u, val->u.uint, error_callback, data);

  if (val->encoding == ATTR_VAL_REF_ALT_INFO)
    {
      struct unit *alt_unit
	= find_unit (ddata->altlink->units, ddata->altlink->units_count,
		     val->u.uint);
      if (alt_unit == NULL)
	return NULL;

      uint64_t offset = val->u.uint - alt_unit->low_offset;
      return read_referenced_name (ddata->altlink, alt_unit, offset,
				   error_callback, data);
    }

  return NULL;
}